

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O3

void __thiscall ON_SubDimple::ON_SubDimple(ON_SubDimple *this,ON_SubDimple *src)

{
  ON__UINT64 *pOVar1;
  ON_SubDLevel *pOVar2;
  undefined8 uVar3;
  undefined3 uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  ON_SubDLevel *this_00;
  ON__UINT64 OVar15;
  ON__UINT64 OVar16;
  long lVar17;
  ON_Xform *pOVar18;
  ON_SubDHash *pOVar19;
  ON_Xform *pOVar20;
  ON_SubDHash *pOVar21;
  ulong uVar22;
  ulong new_capacity;
  byte bVar23;
  ON_SubDArchiveIdMap eptrlist;
  ON_SubDArchiveIdMap local_a8;
  
  bVar23 = 0;
  LOCK();
  UNLOCK();
  OVar16 = (long)Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i + 1;
  Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  this->RuntimeSerialNumber = OVar16;
  this->m_subd_geometry_content_serial_number = 0;
  this->m_subd_render_content_serial_number = 0;
  pOVar19 = &ON_SubDHash::Empty;
  pOVar21 = &this->m_subd_toplology_hash;
  for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar4 = *(undefined3 *)&pOVar19->field_0x1;
    uVar13 = pOVar19->m_vertex_count;
    pOVar21->m_hash_type = pOVar19->m_hash_type;
    *(undefined3 *)&pOVar21->field_0x1 = uVar4;
    pOVar21->m_vertex_count = uVar13;
    pOVar19 = (ON_SubDHash *)&pOVar19->m_edge_count;
    pOVar21 = (ON_SubDHash *)&pOVar21->m_edge_count;
  }
  pOVar19 = &ON_SubDHash::Empty;
  pOVar21 = &this->m_subd_toplology_and_edge_creases_hash;
  for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar4 = *(undefined3 *)&pOVar19->field_0x1;
    uVar13 = pOVar19->m_vertex_count;
    pOVar21->m_hash_type = pOVar19->m_hash_type;
    *(undefined3 *)&pOVar21->field_0x1 = uVar4;
    pOVar21->m_vertex_count = uVar13;
    pOVar19 = (ON_SubDHash *)&pOVar19->m_edge_count;
    pOVar21 = (ON_SubDHash *)&pOVar21->m_edge_count;
  }
  pOVar19 = &ON_SubDHash::Empty;
  pOVar21 = &this->m_subd_geometry_hash;
  for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar4 = *(undefined3 *)&pOVar19->field_0x1;
    uVar13 = pOVar19->m_vertex_count;
    pOVar21->m_hash_type = pOVar19->m_hash_type;
    *(undefined3 *)&pOVar21->field_0x1 = uVar4;
    pOVar21->m_vertex_count = uVar13;
    pOVar19 = (ON_SubDHash *)&pOVar19->m_edge_count;
    pOVar21 = (ON_SubDHash *)&pOVar21->m_edge_count;
  }
  ON_SubDHeap::ON_SubDHeap(&this->m_heap);
  this->m_subd_appearance = Surface;
  this->m_texture_coordinate_type = Unset;
  this->m_reserved = 0;
  ON_MappingTag::ON_MappingTag(&this->m_texture_mapping_tag);
  ON_MappingTag::ON_MappingTag(&this->m_colors_mapping_tag);
  *(undefined4 *)((this->m_fragment_texture_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar3 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_fragment_texture_settings_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_fragment_texture_settings_hash).m_digest + 8) = uVar3;
  uVar3 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_fragment_colors_settings_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_fragment_colors_settings_hash).m_digest + 8) = uVar3;
  *(undefined4 *)((this->m_fragment_colors_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  (this->m_levels)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a078;
  (this->m_levels).m_a = (ON_SubDLevel **)0x0;
  (this->m_levels).m_count = 0;
  (this->m_levels).m_capacity = 0;
  new_capacity = 0;
  this->m_active_level = (ON_SubDLevel *)0x0;
  (this->m_face_packing_id).Data1 = 0;
  (this->m_face_packing_id).Data2 = 0;
  (this->m_face_packing_id).Data3 = 0;
  (this->m_face_packing_id).Data4[0] = '\0';
  (this->m_face_packing_id).Data4[1] = '\0';
  (this->m_face_packing_id).Data4[2] = '\0';
  (this->m_face_packing_id).Data4[3] = '\0';
  (this->m_face_packing_id).Data4[4] = '\0';
  (this->m_face_packing_id).Data4[5] = '\0';
  (this->m_face_packing_id).Data4[6] = '\0';
  (this->m_face_packing_id).Data4[7] = '\0';
  pOVar19 = &ON_SubDHash::Empty;
  pOVar21 = &this->m_face_packing_topology_hash;
  for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar4 = *(undefined3 *)&pOVar19->field_0x1;
    uVar13 = pOVar19->m_vertex_count;
    pOVar21->m_hash_type = pOVar19->m_hash_type;
    *(undefined3 *)&pOVar21->field_0x1 = uVar4;
    pOVar21->m_vertex_count = uVar13;
    pOVar19 = (ON_SubDHash *)((long)pOVar19 + ((ulong)bVar23 * -2 + 1) * 8);
    pOVar21 = (ON_SubDHash *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
  }
  (this->m_symmetry).m_type = Unset;
  (this->m_symmetry).m_coordinates = Unset;
  (this->m_symmetry).m_inversion_order = '\0';
  (this->m_symmetry).m_reserved1 = '\0';
  (this->m_symmetry).m_cyclic_order = 0;
  (this->m_symmetry).m_id.Data1 = 0;
  (this->m_symmetry).m_id.Data2 = 0;
  (this->m_symmetry).m_id.Data3 = 0;
  (this->m_symmetry).m_id.Data4[0] = '\0';
  (this->m_symmetry).m_id.Data4[1] = '\0';
  (this->m_symmetry).m_id.Data4[2] = '\0';
  (this->m_symmetry).m_id.Data4[3] = '\0';
  (this->m_symmetry).m_id.Data4[4] = '\0';
  (this->m_symmetry).m_id.Data4[5] = '\0';
  (this->m_symmetry).m_id.Data4[6] = '\0';
  (this->m_symmetry).m_id.Data4[7] = '\0';
  pOVar18 = &ON_Xform::Nan;
  pOVar20 = &(this->m_symmetry).m_inversion_transform;
  for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
    pOVar20->m_xform[0][0] = pOVar18->m_xform[0][0];
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar23 * -2 + 1) * 8);
    pOVar20 = (ON_Xform *)((long)pOVar20 + (ulong)bVar23 * -0x10 + 8);
  }
  pOVar18 = &ON_Xform::Nan;
  pOVar20 = &(this->m_symmetry).m_cyclic_transform;
  for (lVar17 = 0x10; dVar9 = ON_PlaneEquation::NanPlaneEquation.d,
      dVar8 = ON_PlaneEquation::NanPlaneEquation.y, dVar7 = ON_PlaneEquation::NanPlaneEquation.x,
      lVar17 != 0; lVar17 = lVar17 + -1) {
    pOVar20->m_xform[0][0] = pOVar18->m_xform[0][0];
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar23 * -2 + 1) * 8);
    pOVar20 = (ON_Xform *)((long)pOVar20 + (ulong)bVar23 * -0x10 + 8);
  }
  (this->m_symmetry).m_fixed_plane.z = ON_PlaneEquation::NanPlaneEquation.z;
  (this->m_symmetry).m_fixed_plane.d = dVar9;
  (this->m_symmetry).m_fixed_plane.x = dVar7;
  (this->m_symmetry).m_fixed_plane.y = dVar8;
  dVar11 = ON_Line::NanLine.to.z;
  dVar10 = ON_Line::NanLine.to.y;
  dVar9 = ON_Line::NanLine.to.x;
  dVar8 = ON_Line::NanLine.from.z;
  dVar7 = ON_Line::NanLine.from.y;
  (this->m_symmetry).m_rotation_axis.from.x = ON_Line::NanLine.from.x;
  (this->m_symmetry).m_rotation_axis.from.y = dVar7;
  (this->m_symmetry).m_rotation_axis.from.z = dVar8;
  (this->m_symmetry).m_rotation_axis.to.x = dVar9;
  (this->m_symmetry).m_rotation_axis.to.y = dVar10;
  (this->m_symmetry).m_rotation_axis.to.z = dVar11;
  (this->m_symmetry).m_cleanup_tolerance = 0.0;
  (this->m_symmetry).m_symmetric_object_content_serial_number = 0;
  *(undefined4 *)((this->m_symmetry).m_symmetric_object_topology_hash.m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  uVar3 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_symmetry).m_symmetric_object_topology_hash.m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_symmetry).m_symmetric_object_topology_hash.m_digest + 8) = uVar3;
  *(undefined4 *)((this->m_symmetry).m_symmetric_object_geometry_hash.m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  uVar3 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_symmetry).m_symmetric_object_geometry_hash.m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_symmetry).m_symmetric_object_geometry_hash.m_digest + 8) = uVar3;
  uVar13 = (src->m_levels).m_count;
  if (uVar13 != 0) {
    do {
      uVar14 = uVar13 - 1;
      pOVar2 = (src->m_levels).m_a[uVar14];
      if (((pOVar2 != (ON_SubDLevel *)0x0) && (pOVar2->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
         (pOVar2->m_edge[0] != (ON_SubDEdge *)0x0)) {
        new_capacity = (ulong)uVar13;
        break;
      }
      uVar13 = uVar14;
    } while (uVar14 != 0);
  }
  ON_SubDArchiveIdMap::ON_SubDArchiveIdMap(&local_a8);
  if ((ulong)(long)(this->m_levels).m_capacity < new_capacity) {
    ON_SimpleArray<ON_SubDLevel_*>::SetCapacity(&this->m_levels,new_capacity);
  }
  if ((int)new_capacity != 0) {
    uVar22 = 0;
    do {
      pOVar2 = (src->m_levels).m_a[uVar22];
      this_00 = SubDLevel(this,(uint)uVar22,true);
      if ((this_00 == (ON_SubDLevel *)0x0) ||
         (bVar12 = ON_SubDLevel::CopyHelper(this_00,src,pOVar2,&local_a8,this,true), !bVar12))
      break;
      if (src->m_active_level == pOVar2) {
        this->m_active_level = this_00;
      }
      uVar22 = uVar22 + 1;
    } while (new_capacity != uVar22);
  }
  OVar16 = src->m_subd_render_content_serial_number;
  this->m_subd_geometry_content_serial_number = src->m_subd_geometry_content_serial_number;
  this->m_subd_render_content_serial_number = OVar16;
  this->m_subd_appearance = src->m_subd_appearance;
  this->m_texture_coordinate_type = src->m_texture_coordinate_type;
  memcpy(&this->m_texture_mapping_tag,&src->m_texture_mapping_tag,0x98);
  memcpy(&this->m_colors_mapping_tag,&src->m_colors_mapping_tag,0x98);
  uVar5 = (src->m_face_packing_id).Data2;
  uVar6 = (src->m_face_packing_id).Data3;
  uVar3 = *(undefined8 *)(src->m_face_packing_id).Data4;
  (this->m_face_packing_id).Data1 = (src->m_face_packing_id).Data1;
  (this->m_face_packing_id).Data2 = uVar5;
  (this->m_face_packing_id).Data3 = uVar6;
  *(undefined8 *)(this->m_face_packing_id).Data4 = uVar3;
  pOVar19 = &src->m_face_packing_topology_hash;
  pOVar21 = &this->m_face_packing_topology_hash;
  for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar4 = *(undefined3 *)&pOVar19->field_0x1;
    uVar13 = pOVar19->m_vertex_count;
    pOVar21->m_hash_type = pOVar19->m_hash_type;
    *(undefined3 *)&pOVar21->field_0x1 = uVar4;
    pOVar21->m_vertex_count = uVar13;
    pOVar19 = (ON_SubDHash *)((long)pOVar19 + (ulong)bVar23 * -0x10 + 8);
    pOVar21 = (ON_SubDHash *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
  }
  *(undefined4 *)((this->m_face_packing_topology_hash).m_face_hash.m_digest + 0x10) =
       *(undefined4 *)((src->m_face_packing_topology_hash).m_face_hash.m_digest + 0x10);
  OVar16 = src->RuntimeSerialNumber;
  OVar15 = ON_SubDHash::SubDRuntimeSerialNumber(&src->m_face_packing_topology_hash);
  if (OVar16 == OVar15) {
    OVar16 = this->RuntimeSerialNumber;
  }
  else {
    OVar16 = 0;
  }
  (this->m_face_packing_topology_hash).m_subd_runtime_serial_number = OVar16;
  if (OVar16 == 0) {
    (this->m_face_packing_topology_hash).m_subd_geometry_content_serial_number = 0;
  }
  memcpy(&this->m_symmetry,&src->m_symmetry,0x1a0);
  OVar16 = src->RuntimeSerialNumber;
  pOVar19 = &src->m_subd_toplology_hash;
  OVar15 = ON_SubDHash::SubDRuntimeSerialNumber(pOVar19);
  pOVar1 = &this->m_subd_geometry_content_serial_number;
  if ((OVar16 == OVar15) &&
     (OVar16 = *pOVar1, OVar15 = ON_SubDHash::SubDGeometryContentSerialNumber(pOVar19),
     OVar16 == OVar15)) {
    pOVar21 = &this->m_subd_toplology_hash;
    for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar4 = *(undefined3 *)&pOVar19->field_0x1;
      uVar13 = pOVar19->m_vertex_count;
      pOVar21->m_hash_type = pOVar19->m_hash_type;
      *(undefined3 *)&pOVar21->field_0x1 = uVar4;
      pOVar21->m_vertex_count = uVar13;
      pOVar19 = (ON_SubDHash *)((long)pOVar19 + (ulong)bVar23 * -0x10 + 8);
      pOVar21 = (ON_SubDHash *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
    }
    *(undefined4 *)((this->m_subd_toplology_hash).m_face_hash.m_digest + 0x10) =
         *(undefined4 *)((src->m_subd_toplology_hash).m_face_hash.m_digest + 0x10);
    (this->m_subd_toplology_hash).m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
  OVar16 = src->RuntimeSerialNumber;
  pOVar19 = &src->m_subd_toplology_and_edge_creases_hash;
  OVar15 = ON_SubDHash::SubDRuntimeSerialNumber(pOVar19);
  if ((OVar16 == OVar15) &&
     (OVar16 = *pOVar1, OVar15 = ON_SubDHash::SubDGeometryContentSerialNumber(pOVar19),
     OVar16 == OVar15)) {
    pOVar21 = &this->m_subd_toplology_and_edge_creases_hash;
    for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar4 = *(undefined3 *)&pOVar19->field_0x1;
      uVar13 = pOVar19->m_vertex_count;
      pOVar21->m_hash_type = pOVar19->m_hash_type;
      *(undefined3 *)&pOVar21->field_0x1 = uVar4;
      pOVar21->m_vertex_count = uVar13;
      pOVar19 = (ON_SubDHash *)((long)pOVar19 + (ulong)bVar23 * -0x10 + 8);
      pOVar21 = (ON_SubDHash *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
    }
    *(undefined4 *)((this->m_subd_toplology_and_edge_creases_hash).m_face_hash.m_digest + 0x10) =
         *(undefined4 *)((src->m_subd_toplology_and_edge_creases_hash).m_face_hash.m_digest + 0x10);
    (this->m_subd_toplology_and_edge_creases_hash).m_subd_runtime_serial_number =
         this->RuntimeSerialNumber;
  }
  OVar16 = src->RuntimeSerialNumber;
  pOVar19 = &src->m_subd_geometry_hash;
  OVar15 = ON_SubDHash::SubDRuntimeSerialNumber(pOVar19);
  if ((OVar16 == OVar15) &&
     (OVar16 = *pOVar1, OVar15 = ON_SubDHash::SubDGeometryContentSerialNumber(pOVar19),
     OVar16 == OVar15)) {
    pOVar21 = &this->m_subd_geometry_hash;
    for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar4 = *(undefined3 *)&pOVar19->field_0x1;
      uVar13 = pOVar19->m_vertex_count;
      pOVar21->m_hash_type = pOVar19->m_hash_type;
      *(undefined3 *)&pOVar21->field_0x1 = uVar4;
      pOVar21->m_vertex_count = uVar13;
      pOVar19 = (ON_SubDHash *)((long)pOVar19 + (ulong)bVar23 * -0x10 + 8);
      pOVar21 = (ON_SubDHash *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
    }
    *(undefined4 *)((this->m_subd_geometry_hash).m_face_hash.m_digest + 0x10) =
         *(undefined4 *)((src->m_subd_geometry_hash).m_face_hash.m_digest + 0x10);
    (this->m_subd_geometry_hash).m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
  ON_FixedSizePool::~ON_FixedSizePool(&local_a8.m_fsp);
  return;
}

Assistant:

ON_SubDimple::ON_SubDimple(const ON_SubDimple& src)
  : RuntimeSerialNumber(++ON_SubDimple::Internal_RuntimeSerialNumberGenerator)
{
  const bool bCopyComponentStatus = true;

  unsigned level_count = src.m_levels.UnsignedCount();
  for (/*empty init*/; level_count > 0; level_count--)
  {
    const ON_SubDLevel* src_level = src.m_levels[level_count - 1];
    if (nullptr == src_level)
      continue;
    if (nullptr == src_level->m_vertex[0])
      continue;
    if (nullptr == src_level->m_edge[0])
      continue;
    // it's ok to have subd with just vertices and edges.
    //NO//if (nullptr == src_level->m_face[0])
    //NO//  continue;
    break;
  }

  ON_SubDArchiveIdMap eptrlist;
  m_levels.Reserve(level_count);
  for (unsigned int level_index = 0; level_index < level_count; level_index++)
  {
    const ON_SubDLevel* src_level = src.m_levels[level_index];
    ON_SubDLevel* level = SubDLevel(level_index,true);
    if (nullptr == level)
      break;
    if (false == level->CopyHelper(src, *src_level, eptrlist, *this, bCopyComponentStatus))
      break;
    if ( src.m_active_level == src_level )
      m_active_level = level;
  }

  // this ON_SubDimple is an exact copy of src, so they have identical geometry 
  // and render content.
  m_subd_geometry_content_serial_number = src.m_subd_geometry_content_serial_number;
  m_subd_render_content_serial_number = src.m_subd_render_content_serial_number;

  m_subd_appearance = src.m_subd_appearance;
  m_texture_coordinate_type = src.m_texture_coordinate_type;
  m_texture_mapping_tag = src.m_texture_mapping_tag;
  m_colors_mapping_tag = src.m_colors_mapping_tag;

  // NOTE WELL: (Dale Lear Aug 2023)
  // Fragment settings like the two m_fragment_... values 
  // should be copied only if the mesh fragments are copied
  // and that happens conditionally and happens later
  // if ON_SubDimple::CopyEvaluationCacheForExperts() is called.
  // NO // m_fragment_texture_settings_hash = src.m_fragment_texture_settings_hash;
  // NO // m_fragment_colors_settings_hash = src.m_fragment_colors_settings_hash;

  m_face_packing_id = src.m_face_packing_id;
  m_face_packing_topology_hash = src.m_face_packing_topology_hash;
  m_face_packing_topology_hash.m_subd_runtime_serial_number
    = (src.RuntimeSerialNumber == src.m_face_packing_topology_hash.SubDRuntimeSerialNumber())
    ? this->RuntimeSerialNumber
    : 0;
  if (0 == m_face_packing_topology_hash.m_subd_runtime_serial_number)
    m_face_packing_topology_hash.m_subd_geometry_content_serial_number = 0;

  m_symmetry = src.m_symmetry;

  if (
    src.RuntimeSerialNumber == src.m_subd_toplology_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_toplology_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_toplology_hash is valid - copy it to this
    m_subd_toplology_hash = src.m_subd_toplology_hash;
    m_subd_toplology_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }

  if (
    src.RuntimeSerialNumber == src.m_subd_toplology_and_edge_creases_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_toplology_and_edge_creases_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_toplology_and_edge_crease_hash is valid - copy it to this
    m_subd_toplology_and_edge_creases_hash = src.m_subd_toplology_and_edge_creases_hash;
    m_subd_toplology_and_edge_creases_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }

  if (
    src.RuntimeSerialNumber == src.m_subd_geometry_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_geometry_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_geometry_hash is valid - copy it to this.
    m_subd_geometry_hash = src.m_subd_geometry_hash;
    m_subd_geometry_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
}